

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 *puVar12;
  long lVar13;
  ulong __n;
  undefined1 *puVar14;
  uint __c;
  int iVar15;
  void *__s;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar42;
  undefined1 auVar37 [16];
  int iVar43;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar104;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int iVar105;
  int iVar117;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar118 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  
  __n = (ulong)(uint)left;
  uVar2 = dst->w;
  lVar13 = (long)(int)uVar2;
  iVar3 = dst->h;
  puVar14 = (undefined1 *)src->data;
  __s = dst->data;
  if (type == 0) {
    __c = (uint)(byte)v;
    iVar7 = top;
    if (top < 1) {
      iVar15 = 0;
    }
    else {
      do {
        if (0 < (int)uVar2) {
          memset(__s,(uint)(byte)v,(ulong)uVar2);
        }
        __s = (void *)((long)__s + lVar13);
        iVar7 = iVar7 + -1;
        iVar15 = top;
      } while (iVar7 != 0);
    }
    if (iVar15 < src->h + top) {
      uVar11 = 0;
      if (0 < left) {
        uVar11 = __n;
      }
      do {
        uVar10 = 0;
        if (0 < left) {
          memset(__s,__c,__n);
          uVar10 = __n;
        }
        iVar7 = src->w;
        if ((long)iVar7 < 0xc) {
          uVar9 = uVar11;
          if ((int)uVar10 < iVar7 + left) {
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar14[uVar9 - (long)left];
              uVar10 = uVar9 + 1;
              iVar7 = src->w;
              uVar9 = uVar10;
            } while ((long)uVar10 < (long)(iVar7 + left));
          }
        }
        else {
          memcpy((void *)((long)__s + (long)left),puVar14,(long)iVar7);
          iVar7 = src->w;
          uVar10 = (ulong)(uint)((int)uVar10 + iVar7);
        }
        uVar8 = (uint)uVar10;
        if ((int)uVar8 < (int)uVar2) {
          memset((void *)((long)(int)uVar8 + (long)__s),__c,(ulong)(~uVar8 + uVar2) + 1);
          iVar7 = src->w;
        }
        puVar14 = puVar14 + iVar7;
        __s = (void *)((long)__s + lVar13);
        iVar15 = iVar15 + 1;
      } while (iVar15 < src->h + top);
    }
    iVar7 = iVar3 - iVar15;
    if (iVar7 != 0 && iVar15 <= iVar3) {
      do {
        if (0 < (int)uVar2) {
          memset(__s,__c,(ulong)uVar2);
        }
        __s = (void *)((long)__s + lVar13);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
  }
  puVar12 = puVar14;
  if (type == 1) {
    if (top < 1) {
      iVar7 = 0;
    }
    else {
      lVar5 = (long)left;
      lVar4 = __n - 1;
      auVar39._8_4_ = (int)lVar4;
      auVar39._0_8_ = lVar4;
      auVar39._12_4_ = (int)((ulong)lVar4 >> 0x20);
      iVar15 = 0;
      auVar132 = _DAT_005540a0;
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar1 = *puVar14;
          uVar10 = 0;
          auVar55 = _DAT_00554360;
          auVar123 = _DAT_00554350;
          auVar89 = _DAT_0055fbf0;
          auVar22 = _DAT_0055fbe0;
          auVar25 = _DAT_0055fc50;
          auVar28 = _DAT_0055fc40;
          auVar31 = _DAT_0055fc30;
          auVar34 = _DAT_0055fc20;
          do {
            auVar37 = auVar39 ^ auVar132;
            auVar44 = auVar55 ^ auVar132;
            iVar7 = auVar37._0_4_;
            iVar105 = -(uint)(iVar7 < auVar44._0_4_);
            iVar104 = auVar37._4_4_;
            auVar45._4_4_ = -(uint)(iVar104 < auVar44._4_4_);
            iVar42 = auVar37._8_4_;
            iVar117 = -(uint)(iVar42 < auVar44._8_4_);
            iVar43 = auVar37._12_4_;
            auVar45._12_4_ = -(uint)(iVar43 < auVar44._12_4_);
            auVar80._4_4_ = iVar105;
            auVar80._0_4_ = iVar105;
            auVar80._8_4_ = iVar117;
            auVar80._12_4_ = iVar117;
            auVar118 = pshuflw(in_XMM12,auVar80,0xe8);
            auVar37._4_4_ = -(uint)(auVar44._4_4_ == iVar104);
            auVar37._12_4_ = -(uint)(auVar44._12_4_ == iVar43);
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            auVar119 = pshuflw(in_XMM13,auVar37,0xe8);
            auVar45._0_4_ = auVar45._4_4_;
            auVar45._8_4_ = auVar45._12_4_;
            auVar44 = pshuflw(auVar118,auVar45,0xe8);
            auVar120._8_4_ = 0xffffffff;
            auVar120._0_8_ = 0xffffffffffffffff;
            auVar120._12_4_ = 0xffffffff;
            auVar44 = (auVar44 | auVar119 & auVar118) ^ auVar120;
            auVar44 = packssdw(auVar44,auVar44);
            if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10) = uVar1;
            }
            auVar45 = auVar37 & auVar80 | auVar45;
            auVar37 = packssdw(auVar45,auVar45);
            auVar37 = packssdw(auVar37 ^ auVar120,auVar37 ^ auVar120);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 1) = uVar1;
            }
            auVar37 = auVar123 ^ auVar132;
            iVar105 = -(uint)(iVar7 < auVar37._0_4_);
            auVar119._4_4_ = -(uint)(iVar104 < auVar37._4_4_);
            iVar117 = -(uint)(iVar42 < auVar37._8_4_);
            auVar119._12_4_ = -(uint)(iVar43 < auVar37._12_4_);
            auVar44._4_4_ = iVar105;
            auVar44._0_4_ = iVar105;
            auVar44._8_4_ = iVar117;
            auVar44._12_4_ = iVar117;
            auVar118._4_4_ = -(uint)(auVar37._4_4_ == iVar104);
            auVar118._12_4_ = -(uint)(auVar37._12_4_ == iVar43);
            auVar118._0_4_ = auVar118._4_4_;
            auVar118._8_4_ = auVar118._12_4_;
            auVar119._0_4_ = auVar119._4_4_;
            auVar119._8_4_ = auVar119._12_4_;
            auVar37 = auVar118 & auVar44 | auVar119;
            auVar37 = packssdw(auVar37,auVar37);
            auVar37 = packssdw(auVar37 ^ auVar120,auVar37 ^ auVar120);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 2) = uVar1;
            }
            auVar44 = pshufhw(auVar44,auVar44,0x84);
            auVar80 = pshufhw(auVar118,auVar118,0x84);
            auVar45 = pshufhw(auVar44,auVar119,0x84);
            auVar44 = (auVar45 | auVar80 & auVar44) ^ auVar120;
            auVar44 = packssdw(auVar44,auVar44);
            auVar44 = packsswb(auVar44,auVar44);
            if ((auVar44._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 3) = uVar1;
            }
            auVar44 = auVar89 ^ auVar132;
            iVar105 = -(uint)(iVar7 < auVar44._0_4_);
            auVar47._4_4_ = -(uint)(iVar104 < auVar44._4_4_);
            iVar117 = -(uint)(iVar42 < auVar44._8_4_);
            auVar47._12_4_ = -(uint)(iVar43 < auVar44._12_4_);
            auVar81._4_4_ = iVar105;
            auVar81._0_4_ = iVar105;
            auVar81._8_4_ = iVar117;
            auVar81._12_4_ = iVar117;
            auVar37 = pshuflw(auVar37,auVar81,0xe8);
            auVar46._4_4_ = -(uint)(auVar44._4_4_ == iVar104);
            auVar46._12_4_ = -(uint)(auVar44._12_4_ == iVar43);
            auVar46._0_4_ = auVar46._4_4_;
            auVar46._8_4_ = auVar46._12_4_;
            auVar45 = pshuflw(auVar120,auVar46,0xe8);
            auVar47._0_4_ = auVar47._4_4_;
            auVar47._8_4_ = auVar47._12_4_;
            auVar44 = pshuflw(auVar37,auVar47,0xe8);
            auVar121._8_4_ = 0xffffffff;
            auVar121._0_8_ = 0xffffffffffffffff;
            auVar121._12_4_ = 0xffffffff;
            auVar37 = (auVar44 | auVar45 & auVar37) ^ auVar121;
            auVar37 = packssdw(auVar37,auVar37);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 4) = uVar1;
            }
            auVar47 = auVar46 & auVar81 | auVar47;
            auVar37 = packssdw(auVar47,auVar47);
            auVar37 = packssdw(auVar37 ^ auVar121,auVar37 ^ auVar121);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 5) = uVar1;
            }
            auVar37 = auVar22 ^ auVar132;
            iVar105 = -(uint)(iVar7 < auVar37._0_4_);
            auVar106._4_4_ = -(uint)(iVar104 < auVar37._4_4_);
            iVar117 = -(uint)(iVar42 < auVar37._8_4_);
            auVar106._12_4_ = -(uint)(iVar43 < auVar37._12_4_);
            auVar48._4_4_ = iVar105;
            auVar48._0_4_ = iVar105;
            auVar48._8_4_ = iVar117;
            auVar48._12_4_ = iVar117;
            auVar82._4_4_ = -(uint)(auVar37._4_4_ == iVar104);
            auVar82._12_4_ = -(uint)(auVar37._12_4_ == iVar43);
            auVar82._0_4_ = auVar82._4_4_;
            auVar82._8_4_ = auVar82._12_4_;
            auVar106._0_4_ = auVar106._4_4_;
            auVar106._8_4_ = auVar106._12_4_;
            auVar37 = auVar82 & auVar48 | auVar106;
            auVar37 = packssdw(auVar37,auVar37);
            auVar37 = packssdw(auVar37 ^ auVar121,auVar37 ^ auVar121);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 6) = uVar1;
            }
            auVar44 = pshufhw(auVar48,auVar48,0x84);
            auVar80 = pshufhw(auVar82,auVar82,0x84);
            auVar45 = pshufhw(auVar44,auVar106,0x84);
            auVar44 = (auVar45 | auVar80 & auVar44) ^ auVar121;
            auVar44 = packssdw(auVar44,auVar44);
            auVar44 = packsswb(auVar44,auVar44);
            if ((auVar44._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 7) = uVar1;
            }
            auVar44 = auVar25 ^ auVar132;
            iVar105 = -(uint)(iVar7 < auVar44._0_4_);
            auVar50._4_4_ = -(uint)(iVar104 < auVar44._4_4_);
            iVar117 = -(uint)(iVar42 < auVar44._8_4_);
            auVar50._12_4_ = -(uint)(iVar43 < auVar44._12_4_);
            auVar83._4_4_ = iVar105;
            auVar83._0_4_ = iVar105;
            auVar83._8_4_ = iVar117;
            auVar83._12_4_ = iVar117;
            auVar37 = pshuflw(auVar37,auVar83,0xe8);
            auVar49._4_4_ = -(uint)(auVar44._4_4_ == iVar104);
            auVar49._12_4_ = -(uint)(auVar44._12_4_ == iVar43);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar45 = pshuflw(auVar121,auVar49,0xe8);
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar44 = pshuflw(auVar37,auVar50,0xe8);
            auVar122._8_4_ = 0xffffffff;
            auVar122._0_8_ = 0xffffffffffffffff;
            auVar122._12_4_ = 0xffffffff;
            auVar37 = (auVar44 | auVar45 & auVar37) ^ auVar122;
            auVar37 = packssdw(auVar37,auVar37);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 8) = uVar1;
            }
            auVar50 = auVar49 & auVar83 | auVar50;
            auVar37 = packssdw(auVar50,auVar50);
            auVar37 = packssdw(auVar37 ^ auVar122,auVar37 ^ auVar122);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 9) = uVar1;
            }
            auVar37 = auVar28 ^ auVar132;
            iVar105 = -(uint)(iVar7 < auVar37._0_4_);
            auVar107._4_4_ = -(uint)(iVar104 < auVar37._4_4_);
            iVar117 = -(uint)(iVar42 < auVar37._8_4_);
            auVar107._12_4_ = -(uint)(iVar43 < auVar37._12_4_);
            auVar51._4_4_ = iVar105;
            auVar51._0_4_ = iVar105;
            auVar51._8_4_ = iVar117;
            auVar51._12_4_ = iVar117;
            auVar84._4_4_ = -(uint)(auVar37._4_4_ == iVar104);
            auVar84._12_4_ = -(uint)(auVar37._12_4_ == iVar43);
            auVar84._0_4_ = auVar84._4_4_;
            auVar84._8_4_ = auVar84._12_4_;
            auVar107._0_4_ = auVar107._4_4_;
            auVar107._8_4_ = auVar107._12_4_;
            auVar37 = auVar84 & auVar51 | auVar107;
            auVar37 = packssdw(auVar37,auVar37);
            auVar37 = packssdw(auVar37 ^ auVar122,auVar37 ^ auVar122);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 10) = uVar1;
            }
            auVar44 = pshufhw(auVar51,auVar51,0x84);
            auVar80 = pshufhw(auVar84,auVar84,0x84);
            auVar45 = pshufhw(auVar44,auVar107,0x84);
            auVar44 = (auVar45 | auVar80 & auVar44) ^ auVar122;
            auVar44 = packssdw(auVar44,auVar44);
            auVar44 = packsswb(auVar44,auVar44);
            if ((auVar44._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xb) = uVar1;
            }
            auVar44 = auVar31 ^ auVar132;
            iVar105 = -(uint)(iVar7 < auVar44._0_4_);
            auVar53._4_4_ = -(uint)(iVar104 < auVar44._4_4_);
            iVar117 = -(uint)(iVar42 < auVar44._8_4_);
            auVar53._12_4_ = -(uint)(iVar43 < auVar44._12_4_);
            auVar85._4_4_ = iVar105;
            auVar85._0_4_ = iVar105;
            auVar85._8_4_ = iVar117;
            auVar85._12_4_ = iVar117;
            auVar37 = pshuflw(auVar37,auVar85,0xe8);
            auVar52._4_4_ = -(uint)(auVar44._4_4_ == iVar104);
            auVar52._12_4_ = -(uint)(auVar44._12_4_ == iVar43);
            auVar52._0_4_ = auVar52._4_4_;
            auVar52._8_4_ = auVar52._12_4_;
            auVar45 = pshuflw(auVar122,auVar52,0xe8);
            auVar53._0_4_ = auVar53._4_4_;
            auVar53._8_4_ = auVar53._12_4_;
            auVar44 = pshuflw(auVar37,auVar53,0xe8);
            in_XMM13._8_4_ = 0xffffffff;
            in_XMM13._0_8_ = 0xffffffffffffffff;
            in_XMM13._12_4_ = 0xffffffff;
            auVar37 = (auVar44 | auVar45 & auVar37) ^ in_XMM13;
            auVar37 = packssdw(auVar37,auVar37);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 0xc) = uVar1;
            }
            auVar53 = auVar52 & auVar85 | auVar53;
            auVar37 = packssdw(auVar53,auVar53);
            auVar37 = packssdw(auVar37 ^ in_XMM13,auVar37 ^ in_XMM13);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xd) = uVar1;
            }
            auVar37 = auVar34 ^ auVar132;
            auVar108._0_4_ = -(uint)(iVar7 < auVar37._0_4_);
            auVar108._4_4_ = -(uint)(iVar104 < auVar37._4_4_);
            auVar108._8_4_ = -(uint)(iVar42 < auVar37._8_4_);
            auVar108._12_4_ = -(uint)(iVar43 < auVar37._12_4_);
            auVar54._4_4_ = auVar108._0_4_;
            auVar54._0_4_ = auVar108._0_4_;
            auVar54._8_4_ = auVar108._8_4_;
            auVar54._12_4_ = auVar108._8_4_;
            iVar7 = -(uint)(auVar37._4_4_ == iVar104);
            iVar104 = -(uint)(auVar37._12_4_ == iVar43);
            auVar38._4_4_ = iVar7;
            auVar38._0_4_ = iVar7;
            auVar38._8_4_ = iVar104;
            auVar38._12_4_ = iVar104;
            auVar86._4_4_ = auVar108._4_4_;
            auVar86._0_4_ = auVar108._4_4_;
            auVar86._8_4_ = auVar108._12_4_;
            auVar86._12_4_ = auVar108._12_4_;
            in_XMM12 = auVar38 & auVar54 | auVar86;
            auVar37 = packssdw(auVar108,in_XMM12);
            auVar37 = packssdw(auVar37 ^ in_XMM13,auVar37 ^ in_XMM13);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 0xe) = uVar1;
            }
            auVar44 = pshufhw(auVar54,auVar54,0x84);
            auVar37 = pshufhw(auVar38,auVar38,0x84);
            auVar45 = pshufhw(auVar44,auVar86,0x84);
            auVar37 = packssdw(auVar37 & auVar44,(auVar45 | auVar37 & auVar44) ^ in_XMM13);
            auVar37 = packsswb(auVar37,auVar37);
            if ((auVar37._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xf) = uVar1;
            }
            uVar10 = uVar10 + 0x10;
            lVar4 = auVar55._8_8_;
            auVar55._0_8_ = auVar55._0_8_ + 0x10;
            auVar55._8_8_ = lVar4 + 0x10;
            lVar4 = auVar123._8_8_;
            auVar123._0_8_ = auVar123._0_8_ + 0x10;
            auVar123._8_8_ = lVar4 + 0x10;
            lVar4 = auVar89._8_8_;
            auVar89._0_8_ = auVar89._0_8_ + 0x10;
            auVar89._8_8_ = lVar4 + 0x10;
            lVar4 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 0x10;
            auVar22._8_8_ = lVar4 + 0x10;
            lVar4 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 0x10;
            auVar25._8_8_ = lVar4 + 0x10;
            lVar4 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 0x10;
            auVar28._8_8_ = lVar4 + 0x10;
            lVar4 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 0x10;
            auVar31._8_8_ = lVar4 + 0x10;
            lVar4 = auVar34._8_8_;
            auVar34._0_8_ = auVar34._0_8_ + 0x10;
            auVar34._8_8_ = lVar4 + 0x10;
            uVar11 = __n;
          } while ((left + 0xfU & 0xfffffff0) != uVar10);
        }
        iVar7 = src->w;
        if ((long)iVar7 < 0xc) {
          if ((int)uVar11 < iVar7 + left) {
            do {
              *(undefined1 *)((long)__s + uVar11) = puVar14[uVar11 - lVar5];
              uVar11 = uVar11 + 1;
            } while ((long)uVar11 < src->w + lVar5);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar5),puVar14,(long)iVar7);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
          auVar132 = _DAT_005540a0;
        }
        if ((int)uVar11 < (int)uVar2) {
          lVar4 = (long)(int)uVar11;
          do {
            *(undefined1 *)((long)__s + lVar4) = puVar14[(long)src->w + -1];
            lVar4 = lVar4 + 1;
          } while (lVar13 != lVar4);
        }
        __s = (void *)((long)__s + lVar13);
        iVar15 = iVar15 + 1;
        iVar7 = top;
      } while (iVar15 != top);
    }
    if (iVar7 < src->h + top) {
      lVar4 = __n - 1;
      auVar130._8_4_ = (int)lVar4;
      auVar130._0_8_ = lVar4;
      auVar130._12_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar132 = _DAT_005540a0;
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar1 = *puVar14;
          uVar10 = 0;
          auVar16 = _DAT_00554360;
          auVar18 = _DAT_00554350;
          auVar20 = _DAT_0055fbf0;
          auVar23 = _DAT_0055fbe0;
          auVar26 = _DAT_0055fc50;
          auVar29 = _DAT_0055fc40;
          auVar32 = _DAT_0055fc30;
          auVar35 = _DAT_0055fc20;
          do {
            auVar39 = auVar130 ^ auVar132;
            auVar55 = auVar16 ^ auVar132;
            iVar15 = auVar39._0_4_;
            iVar105 = -(uint)(iVar15 < auVar55._0_4_);
            iVar104 = auVar39._4_4_;
            auVar57._4_4_ = -(uint)(iVar104 < auVar55._4_4_);
            iVar42 = auVar39._8_4_;
            iVar117 = -(uint)(iVar42 < auVar55._8_4_);
            iVar43 = auVar39._12_4_;
            auVar57._12_4_ = -(uint)(iVar43 < auVar55._12_4_);
            auVar87._4_4_ = iVar105;
            auVar87._0_4_ = iVar105;
            auVar87._8_4_ = iVar117;
            auVar87._12_4_ = iVar117;
            auVar39 = pshuflw(in_XMM12,auVar87,0xe8);
            auVar56._4_4_ = -(uint)(auVar55._4_4_ == iVar104);
            auVar56._12_4_ = -(uint)(auVar55._12_4_ == iVar43);
            auVar56._0_4_ = auVar56._4_4_;
            auVar56._8_4_ = auVar56._12_4_;
            auVar123 = pshuflw(in_XMM13,auVar56,0xe8);
            auVar57._0_4_ = auVar57._4_4_;
            auVar57._8_4_ = auVar57._12_4_;
            auVar55 = pshuflw(auVar39,auVar57,0xe8);
            auVar124._8_4_ = 0xffffffff;
            auVar124._0_8_ = 0xffffffffffffffff;
            auVar124._12_4_ = 0xffffffff;
            auVar39 = (auVar55 | auVar123 & auVar39) ^ auVar124;
            auVar39 = packssdw(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10) = uVar1;
            }
            auVar57 = auVar56 & auVar87 | auVar57;
            auVar39 = packssdw(auVar57,auVar57);
            auVar39 = packssdw(auVar39 ^ auVar124,auVar39 ^ auVar124);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 1) = uVar1;
            }
            auVar39 = auVar18 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar39._0_4_);
            auVar109._4_4_ = -(uint)(iVar104 < auVar39._4_4_);
            iVar117 = -(uint)(iVar42 < auVar39._8_4_);
            auVar109._12_4_ = -(uint)(iVar43 < auVar39._12_4_);
            auVar58._4_4_ = iVar105;
            auVar58._0_4_ = iVar105;
            auVar58._8_4_ = iVar117;
            auVar58._12_4_ = iVar117;
            auVar88._4_4_ = -(uint)(auVar39._4_4_ == iVar104);
            auVar88._12_4_ = -(uint)(auVar39._12_4_ == iVar43);
            auVar88._0_4_ = auVar88._4_4_;
            auVar88._8_4_ = auVar88._12_4_;
            auVar109._0_4_ = auVar109._4_4_;
            auVar109._8_4_ = auVar109._12_4_;
            auVar39 = auVar88 & auVar58 | auVar109;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packssdw(auVar39 ^ auVar124,auVar39 ^ auVar124);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 2) = uVar1;
            }
            auVar55 = pshufhw(auVar58,auVar58,0x84);
            auVar89 = pshufhw(auVar88,auVar88,0x84);
            auVar123 = pshufhw(auVar55,auVar109,0x84);
            auVar55 = (auVar123 | auVar89 & auVar55) ^ auVar124;
            auVar55 = packssdw(auVar55,auVar55);
            auVar55 = packsswb(auVar55,auVar55);
            if ((auVar55._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 3) = uVar1;
            }
            auVar55 = auVar20 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar55._0_4_);
            auVar60._4_4_ = -(uint)(iVar104 < auVar55._4_4_);
            iVar117 = -(uint)(iVar42 < auVar55._8_4_);
            auVar60._12_4_ = -(uint)(iVar43 < auVar55._12_4_);
            auVar90._4_4_ = iVar105;
            auVar90._0_4_ = iVar105;
            auVar90._8_4_ = iVar117;
            auVar90._12_4_ = iVar117;
            auVar39 = pshuflw(auVar39,auVar90,0xe8);
            auVar59._4_4_ = -(uint)(auVar55._4_4_ == iVar104);
            auVar59._12_4_ = -(uint)(auVar55._12_4_ == iVar43);
            auVar59._0_4_ = auVar59._4_4_;
            auVar59._8_4_ = auVar59._12_4_;
            auVar123 = pshuflw(auVar124,auVar59,0xe8);
            auVar60._0_4_ = auVar60._4_4_;
            auVar60._8_4_ = auVar60._12_4_;
            auVar55 = pshuflw(auVar39,auVar60,0xe8);
            auVar125._8_4_ = 0xffffffff;
            auVar125._0_8_ = 0xffffffffffffffff;
            auVar125._12_4_ = 0xffffffff;
            auVar39 = (auVar55 | auVar123 & auVar39) ^ auVar125;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 4) = uVar1;
            }
            auVar60 = auVar59 & auVar90 | auVar60;
            auVar39 = packssdw(auVar60,auVar60);
            auVar39 = packssdw(auVar39 ^ auVar125,auVar39 ^ auVar125);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 5) = uVar1;
            }
            auVar39 = auVar23 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar39._0_4_);
            auVar110._4_4_ = -(uint)(iVar104 < auVar39._4_4_);
            iVar117 = -(uint)(iVar42 < auVar39._8_4_);
            auVar110._12_4_ = -(uint)(iVar43 < auVar39._12_4_);
            auVar61._4_4_ = iVar105;
            auVar61._0_4_ = iVar105;
            auVar61._8_4_ = iVar117;
            auVar61._12_4_ = iVar117;
            auVar91._4_4_ = -(uint)(auVar39._4_4_ == iVar104);
            auVar91._12_4_ = -(uint)(auVar39._12_4_ == iVar43);
            auVar91._0_4_ = auVar91._4_4_;
            auVar91._8_4_ = auVar91._12_4_;
            auVar110._0_4_ = auVar110._4_4_;
            auVar110._8_4_ = auVar110._12_4_;
            auVar39 = auVar91 & auVar61 | auVar110;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packssdw(auVar39 ^ auVar125,auVar39 ^ auVar125);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 6) = uVar1;
            }
            auVar55 = pshufhw(auVar61,auVar61,0x84);
            auVar89 = pshufhw(auVar91,auVar91,0x84);
            auVar123 = pshufhw(auVar55,auVar110,0x84);
            auVar55 = (auVar123 | auVar89 & auVar55) ^ auVar125;
            auVar55 = packssdw(auVar55,auVar55);
            auVar55 = packsswb(auVar55,auVar55);
            if ((auVar55._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 7) = uVar1;
            }
            auVar55 = auVar26 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar55._0_4_);
            auVar63._4_4_ = -(uint)(iVar104 < auVar55._4_4_);
            iVar117 = -(uint)(iVar42 < auVar55._8_4_);
            auVar63._12_4_ = -(uint)(iVar43 < auVar55._12_4_);
            auVar92._4_4_ = iVar105;
            auVar92._0_4_ = iVar105;
            auVar92._8_4_ = iVar117;
            auVar92._12_4_ = iVar117;
            auVar39 = pshuflw(auVar39,auVar92,0xe8);
            auVar62._4_4_ = -(uint)(auVar55._4_4_ == iVar104);
            auVar62._12_4_ = -(uint)(auVar55._12_4_ == iVar43);
            auVar62._0_4_ = auVar62._4_4_;
            auVar62._8_4_ = auVar62._12_4_;
            auVar123 = pshuflw(auVar125,auVar62,0xe8);
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar55 = pshuflw(auVar39,auVar63,0xe8);
            auVar126._8_4_ = 0xffffffff;
            auVar126._0_8_ = 0xffffffffffffffff;
            auVar126._12_4_ = 0xffffffff;
            auVar39 = (auVar55 | auVar123 & auVar39) ^ auVar126;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 8) = uVar1;
            }
            auVar63 = auVar62 & auVar92 | auVar63;
            auVar39 = packssdw(auVar63,auVar63);
            auVar39 = packssdw(auVar39 ^ auVar126,auVar39 ^ auVar126);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 9) = uVar1;
            }
            auVar39 = auVar29 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar39._0_4_);
            auVar111._4_4_ = -(uint)(iVar104 < auVar39._4_4_);
            iVar117 = -(uint)(iVar42 < auVar39._8_4_);
            auVar111._12_4_ = -(uint)(iVar43 < auVar39._12_4_);
            auVar64._4_4_ = iVar105;
            auVar64._0_4_ = iVar105;
            auVar64._8_4_ = iVar117;
            auVar64._12_4_ = iVar117;
            auVar93._4_4_ = -(uint)(auVar39._4_4_ == iVar104);
            auVar93._12_4_ = -(uint)(auVar39._12_4_ == iVar43);
            auVar93._0_4_ = auVar93._4_4_;
            auVar93._8_4_ = auVar93._12_4_;
            auVar111._0_4_ = auVar111._4_4_;
            auVar111._8_4_ = auVar111._12_4_;
            auVar39 = auVar93 & auVar64 | auVar111;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packssdw(auVar39 ^ auVar126,auVar39 ^ auVar126);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 10) = uVar1;
            }
            auVar55 = pshufhw(auVar64,auVar64,0x84);
            auVar89 = pshufhw(auVar93,auVar93,0x84);
            auVar123 = pshufhw(auVar55,auVar111,0x84);
            auVar55 = (auVar123 | auVar89 & auVar55) ^ auVar126;
            auVar55 = packssdw(auVar55,auVar55);
            auVar55 = packsswb(auVar55,auVar55);
            if ((auVar55._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xb) = uVar1;
            }
            auVar55 = auVar32 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar55._0_4_);
            auVar66._4_4_ = -(uint)(iVar104 < auVar55._4_4_);
            iVar117 = -(uint)(iVar42 < auVar55._8_4_);
            auVar66._12_4_ = -(uint)(iVar43 < auVar55._12_4_);
            auVar94._4_4_ = iVar105;
            auVar94._0_4_ = iVar105;
            auVar94._8_4_ = iVar117;
            auVar94._12_4_ = iVar117;
            auVar39 = pshuflw(auVar39,auVar94,0xe8);
            auVar65._4_4_ = -(uint)(auVar55._4_4_ == iVar104);
            auVar65._12_4_ = -(uint)(auVar55._12_4_ == iVar43);
            auVar65._0_4_ = auVar65._4_4_;
            auVar65._8_4_ = auVar65._12_4_;
            auVar123 = pshuflw(auVar126,auVar65,0xe8);
            auVar66._0_4_ = auVar66._4_4_;
            auVar66._8_4_ = auVar66._12_4_;
            auVar55 = pshuflw(auVar39,auVar66,0xe8);
            in_XMM13._8_4_ = 0xffffffff;
            in_XMM13._0_8_ = 0xffffffffffffffff;
            in_XMM13._12_4_ = 0xffffffff;
            auVar39 = (auVar55 | auVar123 & auVar39) ^ in_XMM13;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 0xc) = uVar1;
            }
            auVar66 = auVar65 & auVar94 | auVar66;
            auVar39 = packssdw(auVar66,auVar66);
            auVar39 = packssdw(auVar39 ^ in_XMM13,auVar39 ^ in_XMM13);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xd) = uVar1;
            }
            auVar39 = auVar35 ^ auVar132;
            auVar112._0_4_ = -(uint)(iVar15 < auVar39._0_4_);
            auVar112._4_4_ = -(uint)(iVar104 < auVar39._4_4_);
            auVar112._8_4_ = -(uint)(iVar42 < auVar39._8_4_);
            auVar112._12_4_ = -(uint)(iVar43 < auVar39._12_4_);
            auVar67._4_4_ = auVar112._0_4_;
            auVar67._0_4_ = auVar112._0_4_;
            auVar67._8_4_ = auVar112._8_4_;
            auVar67._12_4_ = auVar112._8_4_;
            iVar15 = -(uint)(auVar39._4_4_ == iVar104);
            iVar104 = -(uint)(auVar39._12_4_ == iVar43);
            auVar40._4_4_ = iVar15;
            auVar40._0_4_ = iVar15;
            auVar40._8_4_ = iVar104;
            auVar40._12_4_ = iVar104;
            auVar95._4_4_ = auVar112._4_4_;
            auVar95._0_4_ = auVar112._4_4_;
            auVar95._8_4_ = auVar112._12_4_;
            auVar95._12_4_ = auVar112._12_4_;
            in_XMM12 = auVar40 & auVar67 | auVar95;
            auVar39 = packssdw(auVar112,in_XMM12);
            auVar39 = packssdw(auVar39 ^ in_XMM13,auVar39 ^ in_XMM13);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 0xe) = uVar1;
            }
            auVar55 = pshufhw(auVar67,auVar67,0x84);
            auVar39 = pshufhw(auVar40,auVar40,0x84);
            auVar123 = pshufhw(auVar55,auVar95,0x84);
            auVar39 = packssdw(auVar39 & auVar55,(auVar123 | auVar39 & auVar55) ^ in_XMM13);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xf) = uVar1;
            }
            uVar10 = uVar10 + 0x10;
            lVar4 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 0x10;
            auVar16._8_8_ = lVar4 + 0x10;
            lVar4 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 0x10;
            auVar18._8_8_ = lVar4 + 0x10;
            lVar4 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 0x10;
            auVar20._8_8_ = lVar4 + 0x10;
            lVar4 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 0x10;
            auVar23._8_8_ = lVar4 + 0x10;
            lVar4 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 0x10;
            auVar26._8_8_ = lVar4 + 0x10;
            lVar4 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 0x10;
            auVar29._8_8_ = lVar4 + 0x10;
            lVar4 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + 0x10;
            auVar32._8_8_ = lVar4 + 0x10;
            lVar4 = auVar35._8_8_;
            auVar35._0_8_ = auVar35._0_8_ + 0x10;
            auVar35._8_8_ = lVar4 + 0x10;
            uVar11 = __n;
          } while ((left + 0xfU & 0xfffffff0) != uVar10);
        }
        iVar15 = src->w;
        if ((long)iVar15 < 0xc) {
          if ((int)uVar11 < iVar15 + left) {
            do {
              *(undefined1 *)((long)__s + uVar11) = puVar14[uVar11 - (long)left];
              uVar11 = uVar11 + 1;
              iVar15 = src->w;
            } while ((long)uVar11 < (long)(iVar15 + left));
          }
        }
        else {
          memcpy((void *)((long)__s + (long)left),puVar14,(long)iVar15);
          iVar15 = src->w;
          uVar11 = (ulong)(uint)((int)uVar11 + iVar15);
          auVar132 = _DAT_005540a0;
        }
        if ((int)uVar11 < (int)uVar2) {
          lVar4 = (long)(int)uVar11;
          do {
            *(undefined1 *)((long)__s + lVar4) = puVar14[(long)src->w + -1];
            lVar4 = lVar4 + 1;
          } while (lVar13 != lVar4);
          iVar15 = src->w;
        }
        lVar4 = (long)iVar15;
        puVar14 = puVar14 + lVar4;
        __s = (void *)((long)__s + lVar13);
        iVar7 = iVar7 + 1;
      } while (iVar7 < src->h + top);
    }
    else {
      lVar4 = (long)src->w;
    }
    puVar12 = puVar14 + -lVar4;
    if (iVar7 < iVar3) {
      lVar6 = (long)left;
      lVar5 = __n - 1;
      auVar131._8_4_ = (int)lVar5;
      auVar131._0_8_ = lVar5;
      auVar131._12_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar132 = _DAT_005540a0;
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar1 = *puVar12;
          uVar10 = 0;
          auVar17 = _DAT_00554360;
          auVar19 = _DAT_00554350;
          auVar21 = _DAT_0055fbf0;
          auVar24 = _DAT_0055fbe0;
          auVar27 = _DAT_0055fc50;
          auVar30 = _DAT_0055fc40;
          auVar33 = _DAT_0055fc30;
          auVar36 = _DAT_0055fc20;
          do {
            auVar39 = auVar131 ^ auVar132;
            auVar55 = auVar17 ^ auVar132;
            iVar15 = auVar39._0_4_;
            iVar105 = -(uint)(iVar15 < auVar55._0_4_);
            iVar104 = auVar39._4_4_;
            auVar69._4_4_ = -(uint)(iVar104 < auVar55._4_4_);
            iVar42 = auVar39._8_4_;
            iVar117 = -(uint)(iVar42 < auVar55._8_4_);
            iVar43 = auVar39._12_4_;
            auVar69._12_4_ = -(uint)(iVar43 < auVar55._12_4_);
            auVar96._4_4_ = iVar105;
            auVar96._0_4_ = iVar105;
            auVar96._8_4_ = iVar117;
            auVar96._12_4_ = iVar117;
            auVar39 = pshuflw(in_XMM12,auVar96,0xe8);
            auVar68._4_4_ = -(uint)(auVar55._4_4_ == iVar104);
            auVar68._12_4_ = -(uint)(auVar55._12_4_ == iVar43);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar123 = pshuflw(in_XMM13,auVar68,0xe8);
            auVar69._0_4_ = auVar69._4_4_;
            auVar69._8_4_ = auVar69._12_4_;
            auVar55 = pshuflw(auVar39,auVar69,0xe8);
            auVar127._8_4_ = 0xffffffff;
            auVar127._0_8_ = 0xffffffffffffffff;
            auVar127._12_4_ = 0xffffffff;
            auVar39 = (auVar55 | auVar123 & auVar39) ^ auVar127;
            auVar39 = packssdw(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10) = uVar1;
            }
            auVar69 = auVar68 & auVar96 | auVar69;
            auVar39 = packssdw(auVar69,auVar69);
            auVar39 = packssdw(auVar39 ^ auVar127,auVar39 ^ auVar127);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 1) = uVar1;
            }
            auVar39 = auVar19 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar39._0_4_);
            auVar113._4_4_ = -(uint)(iVar104 < auVar39._4_4_);
            iVar117 = -(uint)(iVar42 < auVar39._8_4_);
            auVar113._12_4_ = -(uint)(iVar43 < auVar39._12_4_);
            auVar70._4_4_ = iVar105;
            auVar70._0_4_ = iVar105;
            auVar70._8_4_ = iVar117;
            auVar70._12_4_ = iVar117;
            auVar97._4_4_ = -(uint)(auVar39._4_4_ == iVar104);
            auVar97._12_4_ = -(uint)(auVar39._12_4_ == iVar43);
            auVar97._0_4_ = auVar97._4_4_;
            auVar97._8_4_ = auVar97._12_4_;
            auVar113._0_4_ = auVar113._4_4_;
            auVar113._8_4_ = auVar113._12_4_;
            auVar39 = auVar97 & auVar70 | auVar113;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packssdw(auVar39 ^ auVar127,auVar39 ^ auVar127);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 2) = uVar1;
            }
            auVar55 = pshufhw(auVar70,auVar70,0x84);
            auVar89 = pshufhw(auVar97,auVar97,0x84);
            auVar123 = pshufhw(auVar55,auVar113,0x84);
            auVar55 = (auVar123 | auVar89 & auVar55) ^ auVar127;
            auVar55 = packssdw(auVar55,auVar55);
            auVar55 = packsswb(auVar55,auVar55);
            if ((auVar55._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 3) = uVar1;
            }
            auVar55 = auVar21 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar55._0_4_);
            auVar72._4_4_ = -(uint)(iVar104 < auVar55._4_4_);
            iVar117 = -(uint)(iVar42 < auVar55._8_4_);
            auVar72._12_4_ = -(uint)(iVar43 < auVar55._12_4_);
            auVar98._4_4_ = iVar105;
            auVar98._0_4_ = iVar105;
            auVar98._8_4_ = iVar117;
            auVar98._12_4_ = iVar117;
            auVar39 = pshuflw(auVar39,auVar98,0xe8);
            auVar71._4_4_ = -(uint)(auVar55._4_4_ == iVar104);
            auVar71._12_4_ = -(uint)(auVar55._12_4_ == iVar43);
            auVar71._0_4_ = auVar71._4_4_;
            auVar71._8_4_ = auVar71._12_4_;
            auVar123 = pshuflw(auVar127,auVar71,0xe8);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar55 = pshuflw(auVar39,auVar72,0xe8);
            auVar128._8_4_ = 0xffffffff;
            auVar128._0_8_ = 0xffffffffffffffff;
            auVar128._12_4_ = 0xffffffff;
            auVar39 = (auVar55 | auVar123 & auVar39) ^ auVar128;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 4) = uVar1;
            }
            auVar72 = auVar71 & auVar98 | auVar72;
            auVar39 = packssdw(auVar72,auVar72);
            auVar39 = packssdw(auVar39 ^ auVar128,auVar39 ^ auVar128);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 5) = uVar1;
            }
            auVar39 = auVar24 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar39._0_4_);
            auVar114._4_4_ = -(uint)(iVar104 < auVar39._4_4_);
            iVar117 = -(uint)(iVar42 < auVar39._8_4_);
            auVar114._12_4_ = -(uint)(iVar43 < auVar39._12_4_);
            auVar73._4_4_ = iVar105;
            auVar73._0_4_ = iVar105;
            auVar73._8_4_ = iVar117;
            auVar73._12_4_ = iVar117;
            auVar99._4_4_ = -(uint)(auVar39._4_4_ == iVar104);
            auVar99._12_4_ = -(uint)(auVar39._12_4_ == iVar43);
            auVar99._0_4_ = auVar99._4_4_;
            auVar99._8_4_ = auVar99._12_4_;
            auVar114._0_4_ = auVar114._4_4_;
            auVar114._8_4_ = auVar114._12_4_;
            auVar39 = auVar99 & auVar73 | auVar114;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packssdw(auVar39 ^ auVar128,auVar39 ^ auVar128);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 6) = uVar1;
            }
            auVar55 = pshufhw(auVar73,auVar73,0x84);
            auVar89 = pshufhw(auVar99,auVar99,0x84);
            auVar123 = pshufhw(auVar55,auVar114,0x84);
            auVar55 = (auVar123 | auVar89 & auVar55) ^ auVar128;
            auVar55 = packssdw(auVar55,auVar55);
            auVar55 = packsswb(auVar55,auVar55);
            if ((auVar55._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 7) = uVar1;
            }
            auVar55 = auVar27 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar55._0_4_);
            auVar75._4_4_ = -(uint)(iVar104 < auVar55._4_4_);
            iVar117 = -(uint)(iVar42 < auVar55._8_4_);
            auVar75._12_4_ = -(uint)(iVar43 < auVar55._12_4_);
            auVar100._4_4_ = iVar105;
            auVar100._0_4_ = iVar105;
            auVar100._8_4_ = iVar117;
            auVar100._12_4_ = iVar117;
            auVar39 = pshuflw(auVar39,auVar100,0xe8);
            auVar74._4_4_ = -(uint)(auVar55._4_4_ == iVar104);
            auVar74._12_4_ = -(uint)(auVar55._12_4_ == iVar43);
            auVar74._0_4_ = auVar74._4_4_;
            auVar74._8_4_ = auVar74._12_4_;
            auVar123 = pshuflw(auVar128,auVar74,0xe8);
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar55 = pshuflw(auVar39,auVar75,0xe8);
            auVar129._8_4_ = 0xffffffff;
            auVar129._0_8_ = 0xffffffffffffffff;
            auVar129._12_4_ = 0xffffffff;
            auVar39 = (auVar55 | auVar123 & auVar39) ^ auVar129;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 8) = uVar1;
            }
            auVar75 = auVar74 & auVar100 | auVar75;
            auVar39 = packssdw(auVar75,auVar75);
            auVar39 = packssdw(auVar39 ^ auVar129,auVar39 ^ auVar129);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 9) = uVar1;
            }
            auVar39 = auVar30 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar39._0_4_);
            auVar115._4_4_ = -(uint)(iVar104 < auVar39._4_4_);
            iVar117 = -(uint)(iVar42 < auVar39._8_4_);
            auVar115._12_4_ = -(uint)(iVar43 < auVar39._12_4_);
            auVar76._4_4_ = iVar105;
            auVar76._0_4_ = iVar105;
            auVar76._8_4_ = iVar117;
            auVar76._12_4_ = iVar117;
            auVar101._4_4_ = -(uint)(auVar39._4_4_ == iVar104);
            auVar101._12_4_ = -(uint)(auVar39._12_4_ == iVar43);
            auVar101._0_4_ = auVar101._4_4_;
            auVar101._8_4_ = auVar101._12_4_;
            auVar115._0_4_ = auVar115._4_4_;
            auVar115._8_4_ = auVar115._12_4_;
            auVar39 = auVar101 & auVar76 | auVar115;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packssdw(auVar39 ^ auVar129,auVar39 ^ auVar129);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 10) = uVar1;
            }
            auVar55 = pshufhw(auVar76,auVar76,0x84);
            auVar89 = pshufhw(auVar101,auVar101,0x84);
            auVar123 = pshufhw(auVar55,auVar115,0x84);
            auVar55 = (auVar123 | auVar89 & auVar55) ^ auVar129;
            auVar55 = packssdw(auVar55,auVar55);
            auVar55 = packsswb(auVar55,auVar55);
            if ((auVar55._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xb) = uVar1;
            }
            auVar55 = auVar33 ^ auVar132;
            iVar105 = -(uint)(iVar15 < auVar55._0_4_);
            auVar78._4_4_ = -(uint)(iVar104 < auVar55._4_4_);
            iVar117 = -(uint)(iVar42 < auVar55._8_4_);
            auVar78._12_4_ = -(uint)(iVar43 < auVar55._12_4_);
            auVar102._4_4_ = iVar105;
            auVar102._0_4_ = iVar105;
            auVar102._8_4_ = iVar117;
            auVar102._12_4_ = iVar117;
            auVar39 = pshuflw(auVar39,auVar102,0xe8);
            auVar77._4_4_ = -(uint)(auVar55._4_4_ == iVar104);
            auVar77._12_4_ = -(uint)(auVar55._12_4_ == iVar43);
            auVar77._0_4_ = auVar77._4_4_;
            auVar77._8_4_ = auVar77._12_4_;
            auVar123 = pshuflw(auVar129,auVar77,0xe8);
            auVar78._0_4_ = auVar78._4_4_;
            auVar78._8_4_ = auVar78._12_4_;
            auVar55 = pshuflw(auVar39,auVar78,0xe8);
            in_XMM13._8_4_ = 0xffffffff;
            in_XMM13._0_8_ = 0xffffffffffffffff;
            in_XMM13._12_4_ = 0xffffffff;
            auVar39 = (auVar55 | auVar123 & auVar39) ^ in_XMM13;
            auVar39 = packssdw(auVar39,auVar39);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 0xc) = uVar1;
            }
            auVar78 = auVar77 & auVar102 | auVar78;
            auVar39 = packssdw(auVar78,auVar78);
            auVar39 = packssdw(auVar39 ^ in_XMM13,auVar39 ^ in_XMM13);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xd) = uVar1;
            }
            auVar39 = auVar36 ^ auVar132;
            auVar116._0_4_ = -(uint)(iVar15 < auVar39._0_4_);
            auVar116._4_4_ = -(uint)(iVar104 < auVar39._4_4_);
            auVar116._8_4_ = -(uint)(iVar42 < auVar39._8_4_);
            auVar116._12_4_ = -(uint)(iVar43 < auVar39._12_4_);
            auVar79._4_4_ = auVar116._0_4_;
            auVar79._0_4_ = auVar116._0_4_;
            auVar79._8_4_ = auVar116._8_4_;
            auVar79._12_4_ = auVar116._8_4_;
            iVar15 = -(uint)(auVar39._4_4_ == iVar104);
            iVar104 = -(uint)(auVar39._12_4_ == iVar43);
            auVar41._4_4_ = iVar15;
            auVar41._0_4_ = iVar15;
            auVar41._8_4_ = iVar104;
            auVar41._12_4_ = iVar104;
            auVar103._4_4_ = auVar116._4_4_;
            auVar103._0_4_ = auVar116._4_4_;
            auVar103._8_4_ = auVar116._12_4_;
            auVar103._12_4_ = auVar116._12_4_;
            in_XMM12 = auVar41 & auVar79 | auVar103;
            auVar39 = packssdw(auVar116,in_XMM12);
            auVar39 = packssdw(auVar39 ^ in_XMM13,auVar39 ^ in_XMM13);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 0xe) = uVar1;
            }
            auVar55 = pshufhw(auVar79,auVar79,0x84);
            auVar39 = pshufhw(auVar41,auVar41,0x84);
            auVar123 = pshufhw(auVar55,auVar103,0x84);
            auVar39 = packssdw(auVar39 & auVar55,(auVar123 | auVar39 & auVar55) ^ in_XMM13);
            auVar39 = packsswb(auVar39,auVar39);
            if ((auVar39._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xf) = uVar1;
            }
            uVar10 = uVar10 + 0x10;
            lVar5 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 0x10;
            auVar17._8_8_ = lVar5 + 0x10;
            lVar5 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 0x10;
            auVar19._8_8_ = lVar5 + 0x10;
            lVar5 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 0x10;
            auVar21._8_8_ = lVar5 + 0x10;
            lVar5 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 0x10;
            auVar24._8_8_ = lVar5 + 0x10;
            lVar5 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 0x10;
            auVar27._8_8_ = lVar5 + 0x10;
            lVar5 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 0x10;
            auVar30._8_8_ = lVar5 + 0x10;
            lVar5 = auVar33._8_8_;
            auVar33._0_8_ = auVar33._0_8_ + 0x10;
            auVar33._8_8_ = lVar5 + 0x10;
            lVar5 = auVar36._8_8_;
            auVar36._0_8_ = auVar36._0_8_ + 0x10;
            auVar36._8_8_ = lVar5 + 0x10;
            uVar11 = __n;
          } while ((left + 0xfU & 0xfffffff0) != uVar10);
        }
        iVar15 = src->w;
        if ((long)iVar15 < 0xc) {
          if ((int)uVar11 < iVar15 + left) {
            do {
              *(undefined1 *)((long)__s + uVar11) = puVar14[uVar11 + (-lVar6 - lVar4)];
              uVar11 = uVar11 + 1;
            } while ((long)uVar11 < src->w + lVar6);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar6),puVar12,(long)iVar15);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
          auVar132 = _DAT_005540a0;
        }
        if ((int)uVar11 < (int)uVar2) {
          lVar5 = (long)(int)uVar11;
          do {
            *(undefined1 *)((long)__s + lVar5) = puVar12[(long)src->w + -1];
            lVar5 = lVar5 + 1;
          } while (lVar13 != lVar5);
        }
        __s = (void *)((long)__s + lVar13);
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar3);
    }
  }
  if (type == 2) {
    uVar11 = (ulong)(uint)src->w;
    puVar12 = puVar12 + src->w * top;
    lVar4 = (long)left;
    if (top < 1) {
      iVar7 = 0;
    }
    else {
      iVar15 = 0;
      do {
        uVar10 = 0;
        if (0 < left) {
          puVar14 = puVar12 + lVar4;
          uVar11 = 0;
          do {
            *(undefined1 *)((long)__s + uVar11) = *puVar14;
            uVar11 = uVar11 + 1;
            puVar14 = puVar14 + -1;
          } while (__n != uVar11);
          uVar11 = (ulong)(uint)src->w;
          uVar10 = __n;
        }
        if ((int)uVar11 < 0xc) {
          if ((int)uVar10 < (int)uVar11 + left) {
            do {
              *(undefined1 *)((long)__s + uVar10) = puVar12[uVar10 - lVar4];
              uVar10 = uVar10 + 1;
              uVar11 = (ulong)(uint)src->w;
            } while ((long)uVar10 < (long)(src->w + left));
          }
        }
        else {
          memcpy((void *)((long)__s + lVar4),puVar12,uVar11);
          uVar11 = (ulong)(uint)src->w;
          uVar10 = (ulong)(uint)((int)uVar10 + src->w);
        }
        iVar7 = (int)uVar10;
        if (iVar7 < (int)uVar2) {
          lVar5 = (long)iVar7;
          iVar7 = (left + -2) - iVar7;
          do {
            *(undefined1 *)((long)__s + lVar5) = puVar12[iVar7 + src->w * 2];
            lVar5 = lVar5 + 1;
            iVar7 = iVar7 + -1;
          } while (lVar13 != lVar5);
          uVar11 = (ulong)(uint)src->w;
        }
        __s = (void *)((long)__s + lVar13);
        puVar12 = puVar12 + -(long)(int)uVar11;
        iVar15 = iVar15 + 1;
        iVar7 = top;
      } while (iVar15 != top);
    }
    if (iVar7 < src->h + top) {
      do {
        uVar10 = 0;
        if (0 < left) {
          puVar14 = puVar12 + lVar4;
          uVar11 = 0;
          do {
            *(undefined1 *)((long)__s + uVar11) = *puVar14;
            uVar11 = uVar11 + 1;
            puVar14 = puVar14 + -1;
          } while (__n != uVar11);
          uVar11 = (ulong)(uint)src->w;
          uVar10 = __n;
        }
        if ((int)uVar11 < 0xc) {
          if ((int)uVar10 < (int)uVar11 + left) {
            do {
              *(undefined1 *)((long)__s + uVar10) = puVar12[uVar10 - lVar4];
              uVar10 = uVar10 + 1;
              uVar11 = (ulong)(uint)src->w;
            } while ((long)uVar10 < (long)(src->w + left));
          }
        }
        else {
          memcpy((void *)((long)__s + lVar4),puVar12,uVar11);
          uVar11 = (ulong)(uint)src->w;
          uVar10 = (ulong)(uint)((int)uVar10 + src->w);
        }
        iVar15 = (int)uVar10;
        if (iVar15 < (int)uVar2) {
          lVar5 = (long)iVar15;
          iVar15 = (left + -2) - iVar15;
          do {
            *(undefined1 *)((long)__s + lVar5) = puVar12[iVar15 + src->w * 2];
            lVar5 = lVar5 + 1;
            iVar15 = iVar15 + -1;
          } while (lVar13 != lVar5);
          uVar11 = (ulong)(uint)src->w;
        }
        puVar12 = puVar12 + (int)uVar11;
        __s = (void *)((long)__s + lVar13);
        iVar7 = iVar7 + 1;
      } while (iVar7 < src->h + top);
    }
    if (iVar7 < iVar3) {
      puVar12 = puVar12 + -(long)((int)uVar11 * 2);
      do {
        uVar10 = 0;
        if (0 < left) {
          puVar14 = puVar12 + lVar4;
          uVar11 = 0;
          do {
            *(undefined1 *)((long)__s + uVar11) = *puVar14;
            uVar11 = uVar11 + 1;
            puVar14 = puVar14 + -1;
          } while (__n != uVar11);
          uVar11 = (ulong)(uint)src->w;
          uVar10 = __n;
        }
        if ((int)uVar11 < 0xc) {
          if ((int)uVar10 < (int)uVar11 + left) {
            do {
              *(undefined1 *)((long)__s + uVar10) = puVar12[uVar10 - lVar4];
              uVar10 = uVar10 + 1;
              uVar11 = (ulong)(uint)src->w;
            } while ((long)uVar10 < (long)(src->w + left));
          }
        }
        else {
          memcpy((void *)((long)__s + lVar4),puVar12,uVar11);
          uVar11 = (ulong)(uint)src->w;
          uVar10 = (ulong)(uint)((int)uVar10 + src->w);
        }
        iVar15 = (int)uVar10;
        if (iVar15 < (int)uVar2) {
          lVar5 = (long)iVar15;
          iVar15 = (left + -2) - iVar15;
          do {
            *(undefined1 *)((long)__s + lVar5) = puVar12[iVar15 + src->w * 2];
            lVar5 = lVar5 + 1;
            iVar15 = iVar15 + -1;
          } while (lVar13 != lVar5);
          uVar11 = (ulong)(uint)src->w;
        }
        __s = (void *)((long)__s + lVar13);
        puVar12 = puVar12 + -(long)(int)uVar11;
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar3);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }
}